

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_tcp_storage.h
# Opt level: O3

void __thiscall cppcms::sessions::tcp_storage::~tcp_storage(tcp_storage *this)

{
  pointer piVar1;
  
  (this->super_session_storage)._vptr_session_storage = (_func_int **)&PTR_save_0028a618;
  piVar1 = (this->ports_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->ips_);
  booster::intrusive_ptr<booster::details::key>::~intrusive_ptr(&(this->tcp_).key_);
  operator_delete(this);
  return;
}

Assistant:

class CPPCMS_API tcp_storage : public session_storage {
public:
	tcp_storage(std::vector<std::string> const &ips,std::vector<int> const &ports) :
		ips_(ips),
		ports_(ports)
	{
	}
	virtual void save(std::string const &sid,time_t timeout,std::string const &in);
	virtual bool load(std::string const &sid,time_t &timeout,std::string &out);
	virtual void remove(std::string const &sid);
	virtual bool is_blocking();
	cppcms::impl::tcp_connector &tcp();
private:
	booster::thread_specific_ptr<cppcms::impl::tcp_connector> tcp_;
	std::vector<std::string> ips_;
	std::vector<int> ports_;
}